

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  void *pvVar3;
  size_t __n;
  
  sVar2 = 0xffffffffffffffff;
  __n = this->length_ - pos;
  if (pos <= this->length_ && __n != 0) {
    pcVar1 = this->ptr_;
    pvVar3 = memchr(pcVar1 + pos,(int)c,__n);
    sVar2 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar1;
  }
  return sVar2;
}

Assistant:

StringPiece::size_type StringPiece::find(char c, size_type pos) const {
  if (length_ <= 0 || pos >= static_cast<size_type>(length_)) {
    return npos;
  }
  const char* result = static_cast<const char*>(
      memchr(ptr_ + pos, c, length_ - pos));
  return result != nullptr ? result - ptr_ : npos;
}